

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmespath.hpp
# Opt level: O0

reference __thiscall
jsoncons::jmespath::detail::
jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
max_by_function::evaluate
          (max_by_function *this,
          vector<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
          *args,eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                *context,error_code *ec)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  type_conflict9 tVar4;
  int iVar5;
  size_type sVar6;
  unsigned_long *puVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  const_reference pvVar8;
  reference pbVar9;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *peVar10
  ;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *pbVar11;
  size_t sVar12;
  undefined4 extraout_var;
  undefined8 in_RDX;
  vector<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  *in_RSI;
  function_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *in_RDI
  ;
  reference key2;
  size_t i;
  size_t index;
  bool is_string;
  bool is_number;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> key1;
  error_code ec2;
  expression_type *expr;
  reference arg0;
  string *in_stack_fffffffffffffed8;
  error_code *in_stack_fffffffffffffee0;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_fffffffffffffee8;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *in_stack_fffffffffffffef0;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *peVar13
  ;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_fffffffffffffef8;
  allocator<char> *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  ulong local_b8;
  undefined4 in_stack_ffffffffffffff58;
  undefined2 in_stack_ffffffffffffff5c;
  undefined1 in_stack_ffffffffffffff5e;
  undefined1 in_stack_ffffffffffffff5f;
  size_t in_stack_ffffffffffffff70;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  reference local_8;
  
  sVar6 = std::
          vector<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
          ::size(in_RSI);
  function_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::arity
            (in_RDI);
  puVar7 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)0x4d802c);
  if (sVar6 != *puVar7) {
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              __cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    assertion_error::assertion_error
              ((assertion_error *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    __cxa_throw(this_00,&assertion_error::typeinfo,assertion_error::~assertion_error);
  }
  pvVar8 = std::
           vector<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
           ::operator[](in_RSI,0);
  bVar1 = parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
          is_value(pvVar8);
  if (bVar1) {
    pvVar8 = std::
             vector<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
             ::operator[](in_RSI,1);
    bVar1 = parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
            is_expression(pvVar8);
    if (bVar1) {
      pvVar8 = std::
               vector<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
               ::operator[](in_RSI,0);
      parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::value
                (pvVar8);
      bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_array
                        (in_stack_fffffffffffffef8);
      if (!bVar1) {
        std::error_code::operator=
                  ((error_code *)in_stack_fffffffffffffef0,
                   (jmespath_errc)((ulong)in_stack_fffffffffffffee8 >> 0x20));
        pbVar9 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                 ::null_value(in_stack_fffffffffffffef0);
        return pbVar9;
      }
      bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::empty
                        ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                         CONCAT17(in_stack_ffffffffffffff5f,
                                  CONCAT16(in_stack_ffffffffffffff5e,
                                           CONCAT24(in_stack_ffffffffffffff5c,
                                                    in_stack_ffffffffffffff58))));
      if (bVar1) {
        pbVar9 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                 ::null_value(in_stack_fffffffffffffef0);
        return pbVar9;
      }
      pvVar8 = std::
               vector<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
               ::operator[](in_RSI,1);
      peVar10 = (eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                 *)parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                   ::expression(pvVar8);
      std::error_code::error_code(in_stack_fffffffffffffee0);
      peVar13 = peVar10;
      pbVar11 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                          (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      (*(code *)(peVar13->temp_storage_->
                super__Vector_base<std::unique_ptr<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::default_delete<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::default_delete<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage)
                (peVar13,pbVar11,in_RDX,&stack0xffffffffffffff70);
      basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::basic_json
                ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                 in_stack_fffffffffffffee0,
                 (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                 in_stack_fffffffffffffed8);
      bVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_number
                        (in_stack_fffffffffffffef8);
      bVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_string
                        (in_stack_fffffffffffffef8);
      if (((bVar2 & 1) != 0) || ((bool)bVar3)) {
        for (local_b8 = 1;
            sVar12 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                               (in_stack_fffffffffffffee8), local_b8 < sVar12;
            local_b8 = local_b8 + 1) {
          peVar13 = peVar10;
          pbVar11 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                              (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
          iVar5 = (*(code *)(peVar13->temp_storage_->
                            super__Vector_base<std::unique_ptr<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::default_delete<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::default_delete<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_end_of_storage)
                            (peVar13,pbVar11,in_RDX,&stack0xffffffffffffff70);
          in_stack_fffffffffffffee8 =
               (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
               CONCAT44(extraout_var,iVar5);
          bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_number
                            (pbVar11);
          if ((bVar1 != (bool)(bVar2 & 1)) ||
             (bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_string
                                (pbVar11), bVar1 != (bool)(bVar3 & 1))) {
            std::error_code::operator=
                      ((error_code *)peVar13,
                       (jmespath_errc)((ulong)in_stack_fffffffffffffee8 >> 0x20));
            local_8 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                      ::null_value(peVar13);
            goto LAB_004d84ce;
          }
          tVar4 = operator>((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                            in_stack_fffffffffffffee0,
                            (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                            in_stack_fffffffffffffed8);
          if (tVar4) {
            basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::operator=
                      ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                       in_stack_fffffffffffffee0,
                       (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                       in_stack_fffffffffffffed8);
          }
        }
        local_8 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                            (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      }
      else {
        std::error_code::operator=
                  ((error_code *)in_stack_fffffffffffffef0,
                   (jmespath_errc)((ulong)in_stack_fffffffffffffee8 >> 0x20));
        local_8 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                  ::null_value(in_stack_fffffffffffffef0);
      }
LAB_004d84ce:
      basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::~basic_json
                ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x4d84db);
      return local_8;
    }
  }
  std::error_code::operator=
            ((error_code *)in_stack_fffffffffffffef0,
             (jmespath_errc)((ulong)in_stack_fffffffffffffee8 >> 0x20));
  pbVar9 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
           ::null_value(in_stack_fffffffffffffef0);
  return pbVar9;
}

Assistant:

reference evaluate(const std::vector<parameter_type>& args, eval_context<Json>& context, std::error_code& ec) const override
            {
                JSONCONS_ASSERT(args.size() == *this->arity());

                if (!(args[0].is_value() && args[1].is_expression()))
                {
                    ec = jmespath_errc::invalid_type;
                    return context.null_value();
                }

                reference arg0 = args[0].value();
                if (!arg0.is_array())
                {
                    ec = jmespath_errc::invalid_type;
                    return context.null_value();
                }
                if (arg0.empty())
                {
                    return context.null_value();
                }

                const auto& expr = args[1].expression();

                std::error_code ec2;
                Json key1 = expr.evaluate(arg0.at(0), context, ec2); 

                bool is_number = key1.is_number();
                bool is_string = key1.is_string();
                if (!(is_number || is_string))
                {
                    ec = jmespath_errc::invalid_type;
                    return context.null_value();
                }

                std::size_t index = 0;
                for (std::size_t i = 1; i < arg0.size(); ++i)
                {
                    reference key2 = expr.evaluate(arg0.at(i), context, ec2); 
                    if (!(key2.is_number() == is_number && key2.is_string() == is_string))
                    {
                        ec = jmespath_errc::invalid_type;
                        return context.null_value();
                    }
                    if (key2 > key1)
                    {
                        key1 = key2;
                        index = i;
                    }
                }

                return arg0.at(index);
            }